

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O2

void __thiscall DNSResolve::ParseHosts(DNSResolve *this)

{
  byte *pbVar1;
  byte bVar2;
  long *plVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  byte *pbVar6;
  byte *pbVar7;
  string ip;
  string hostname;
  ifstream fhost;
  char line [400];
  char host_path [260];
  
  builtin_strncpy(host_path,"/etc/hosts",0xb);
  std::ifstream::ifstream(&fhost,host_path,_S_in);
LAB_00116f76:
  do {
    plVar3 = (long *)std::istream::getline((char *)&fhost,(long)line);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      std::ifstream::close();
      std::ifstream::~ifstream(&fhost);
      return;
    }
    pbVar6 = (byte *)line;
    pbVar7 = (byte *)line;
    while( true ) {
      pbVar6 = pbVar6 + 1;
      bVar2 = *pbVar7;
      if ((bVar2 != 9) && (bVar2 != 0x20)) break;
      pbVar7 = pbVar7 + 1;
    }
  } while ((bVar2 == 0) || (bVar2 == 0x23));
  hostname._M_dataplus._M_p = (pointer)&hostname.field_2;
  hostname._M_string_length = 0;
  hostname.field_2._M_local_buf[0] = '\0';
  ip._M_dataplus._M_p = (pointer)&ip.field_2;
  ip._M_string_length = 0;
  ip.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar2 = *pbVar7;
    uVar4 = (ulong)bVar2;
    if (bVar2 == 0) break;
    if ((bVar2 == 0x20) || (bVar2 == 9)) goto LAB_0011701b;
    pbVar7 = pbVar7 + 1;
    pbVar6 = pbVar6 + 1;
    std::__cxx11::string::push_back((char)&ip);
  }
  goto LAB_0011706c;
LAB_0011701b:
  while (((char)uVar4 == '\t' || ((int)uVar4 == 0x20))) {
    pbVar1 = pbVar7 + 1;
    pbVar7 = pbVar7 + 1;
    pbVar6 = pbVar6 + 1;
    uVar4 = (ulong)*pbVar1;
  }
  if ((int)uVar4 != 0) {
    while ((0x20 < (byte)uVar4 || ((0x100000201U >> (uVar4 & 0x3f) & 1) == 0))) {
      std::__cxx11::string::push_back((char)&hostname);
      bVar2 = *pbVar6;
      pbVar6 = pbVar6 + 1;
      uVar4 = (ulong)bVar2;
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->hosts_,&hostname);
    std::__cxx11::string::_M_assign((string *)pmVar5);
  }
LAB_0011706c:
  std::__cxx11::string::~string((string *)&ip);
  std::__cxx11::string::~string((string *)&hostname);
  goto LAB_00116f76;
}

Assistant:

void DNSResolve::ParseHosts()
{
    char host_path[260];
#ifdef _WIN32
    GetWindowsDirectoryA(host_path, 260);
    strcat(host_path, "\\system32\\drivers\\etc\\hosts");
#else
    strcpy(host_path, "/etc/hosts");
#endif
    ifstream fhost(host_path);
    char line[400];
    while (fhost.getline(line, 400))
    {
        char* p = line;
        while (*p == ' ' || *p == '\t') p++;
        if (*p == '\0' || *p == '#') continue;
        string hostname, ip;
        while (*p != ' ' && *p != '\t' && *p != '\0')
        {
            ip.push_back(*p++);
        }
        if (*p == '\0') continue;
        while (*p == ' ' || *p == '\t') p++;
        if (*p == '\0') continue;
        while (*p != ' ' && *p != '\t' && *p != '\0')
        {
            hostname.push_back(*p++);
        }
        hosts_[hostname] = ip;
    }
    fhost.close();
}